

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O3

string * __thiscall Noise::getParameter(string *__return_storage_ptr__,Noise *this,string *name)

{
  int iVar1;
  long lVar2;
  stringstream param;
  string local_1c0;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    lVar2 = 0x170;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      lVar2 = 0x168;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 == 0) {
        lVar2 = 0x158;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)name);
        if (iVar1 != 0) {
          Parametric::getParameter(&local_1c0,(Parametric *)this,name);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
            operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00139aa6;
        }
        lVar2 = 0x160;
      }
    }
  }
  std::ostream::_M_insert<double>
            (*(double *)
              ((long)&(this->super_StochasticVariable).super_StochasticProcess.super_Parametric.
                      _vptr_Parametric + lVar2));
LAB_00139aa6:
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string Noise::getParameter( const string& name ) const
{
	stringstream param;
	if (name == "mean")
		param << noiseMu;
	else if (name == "std.dev.")
		param << noiseSigma;
	else if (name == "weight")
		param << noiseWeight;
	else if (name == "rate")
		param << noiseRate;
	else
		param << StochasticVariable::getParameter(name);
		
	return param.str();
}